

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_push_front_and_push_back.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d [5];
  
  local_d[1] = false;
  local_d[2] = false;
  local_d[3] = false;
  local_d[4] = false;
  local_d[0] = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<> > , dimensions<dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,local_d);
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn> > , dimensions<dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_e);
  local_f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn, dyn> > , dimensions<dyn, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_f);
  local_10 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<> > , dimensions<3> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x30,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_10);
  local_11 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5> > , dimensions<3, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x34,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_11);
  local_12 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5, 9> > , dimensions<3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x38,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_12);
  local_13 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5> > , dimensions<dyn, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x3d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_13);
  local_14 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<5, dimensions<dyn> > , dimensions<5, dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x41,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_14);
  local_15 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5, 9> > , dimensions<dyn, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x46,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_15);
  local_16 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<dyn, 9> > , dimensions<3, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x4a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_16);
  local_17 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<5, dyn> > , dimensions<3, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x4e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_17);
  local_18 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<3, dimensions<dyn, dyn> > , dimensions<3, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_18);
  local_19 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<5, dyn> > , dimensions<dyn, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x57,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_19);
  local_1a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_front<dyn, dimensions<dyn, 9> > , dimensions<dyn, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x5b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1a);
  local_1b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<> > , dimensions<dyn> >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,100,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1b);
  local_1c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn> > , dimensions<dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x68,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1c);
  local_1d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn, dyn> > , dimensions<dyn, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x6c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1d);
  local_1e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<3, dimensions<> > , dimensions<3> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1e);
  local_1f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<5, dimensions<3> > , dimensions<3, 5> >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x75,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1f);
  local_20 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<3, 5> > , dimensions<3, 5, 9> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x79,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_20);
  local_21 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<5, dimensions<dyn> > , dimensions<dyn, 5> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x7e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_21);
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<5> > , dimensions<5, dyn> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x82,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_22);
  local_23 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<dyn, 5> > , dimensions<dyn, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x87,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_23);
  local_24 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<3, dyn> > , dimensions<3, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x8b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_24);
  local_25 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<3, 5> > , dimensions<3, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x8f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_25);
  local_26 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<3, dyn> > , dimensions<3, dyn, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x94,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_26);
  local_27 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<dyn, dimensions<dyn, 5> > , dimensions<dyn, 5, dyn> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x98,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_27);
  local_28 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< dimensions_push_back<9, dimensions<dyn, dyn> > , dimensions<dyn, dyn, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x9c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_28);
  local_29 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t> >::type , integer_sequence<std::size_t, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xa7,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_29);
  local_2a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xad,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2a);
  local_2b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 0, 0> >::type , integer_sequence<std::size_t, 0, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xb3,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2b);
  local_2c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 1> >::type , integer_sequence<std::size_t, 0, 1> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xba,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2c);
  local_2d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< std::size_t, 0, integer_sequence<std::size_t, 1, 2> >::type , integer_sequence<std::size_t, 0, 1, 2> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xc0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2d);
  local_2e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< int, 3, integer_sequence<int, 5> >::type , integer_sequence<int, 3, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,199,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2e);
  local_2f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_front< int, 3, integer_sequence<int, 5, 9> >::type , integer_sequence<int, 3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xcd,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2f);
  local_30 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t> >::type , integer_sequence<std::size_t, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xd8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_30);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xde,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 0, integer_sequence<std::size_t, 0, 0> >::type , integer_sequence<std::size_t, 0, 0, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xe4,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_33 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 1, integer_sequence<std::size_t, 0> >::type , integer_sequence<std::size_t, 0, 1> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xeb,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_33);
  local_34 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< std::size_t, 2, integer_sequence<std::size_t, 0, 1> >::type , integer_sequence<std::size_t, 0, 1, 2> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xf1,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_34);
  local_35 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< int, 5, integer_sequence<int, 3> >::type , integer_sequence<int, 3, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xf8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_35);
  local_36 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< integer_sequence_push_back< int, 9, integer_sequence<int, 3, 5> >::type , integer_sequence<int, 3, 5, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0xfe,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_36);
  local_37 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<> >::type , type_list<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x107,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_37);
  local_38 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<int> >::type , type_list<int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x10b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_38);
  local_39 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<int, int> >::type , type_list<int, int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x10f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_39);
  local_3a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<char> >::type , type_list<int, char> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x114,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3a);
  local_3b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_front<int, type_list<char, bool> >::type , type_list<int, char, bool> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x118,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3b);
  local_3c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<> >::type , type_list<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x121,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3c);
  local_3d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<int> >::type , type_list<int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x125,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3d);
  local_3e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<int, type_list<int, int> >::type , type_list<int, int, int> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x129,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3e);
  local_3f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<char, type_list<int> >::type , type_list<int, char> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x12e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_3f);
  local_40 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< type_list_push_back<bool, type_list<int, char> >::type , type_list<int, char, bool> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_push_front_and_push_back.cpp"
             ,0x132,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_40);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    { // dimensions_push_front {{{

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<> >
          , dimensions<dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn> >
          , dimensions<dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<> >
          , dimensions<3>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5> >
          , dimensions<3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5, 9> >
          , dimensions<3, 5, 9>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5> >
          , dimensions<dyn, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<5, dimensions<dyn> >
          , dimensions<5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5, 9> >
          , dimensions<dyn, 5, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<dyn, 9> >
          , dimensions<3, dyn, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<5, dyn> >
          , dimensions<3, 5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_front<3, dimensions<dyn, dyn> >
          , dimensions<3, dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<5, dyn> >
          , dimensions<dyn, 5, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_front<dyn, dimensions<dyn, 9> >
          , dimensions<dyn, dyn, 9>
        >::value), true);

    } // }}}

    { // dimensions_push_back {{{

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<> >
          , dimensions<dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn> >
          , dimensions<dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<3, dimensions<> >
          , dimensions<3>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<5, dimensions<3> >
          , dimensions<3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<3, 5> >
          , dimensions<3, 5, 9>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<5, dimensions<dyn> >
          , dimensions<dyn, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<5> >
          , dimensions<5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<dyn, 5> >
          , dimensions<dyn, 5, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<3, dyn> >
          , dimensions<3, dyn, 9>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<3, 5> >
          , dimensions<3, 5, dyn>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<3, dyn> >
          , dimensions<3, dyn, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<dyn, dimensions<dyn, 5> >
          , dimensions<dyn, 5, dyn>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            dimensions_push_back<9, dimensions<dyn, dyn> >
          , dimensions<dyn, dyn, 9>
        >::value), true);

    } // }}}

    { // integer_sequence_push_front {{{

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t>
            >::type
          , integer_sequence<std::size_t, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 0, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0, 0>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 1>
            >::type
          , integer_sequence<std::size_t, 0, 1>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                std::size_t, 0, integer_sequence<std::size_t, 1, 2>
            >::type
          , integer_sequence<std::size_t, 0, 1, 2>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                int, 3, integer_sequence<int, 5>
            >::type
          , integer_sequence<int, 3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_front<
                int, 3, integer_sequence<int, 5, 9>
            >::type
          , integer_sequence<int, 3, 5, 9>
        >::value), true);

    } // }}}

    { // integer_sequence_push_back {{{

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t>
            >::type
          , integer_sequence<std::size_t, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 0, integer_sequence<std::size_t, 0, 0>
            >::type
          , integer_sequence<std::size_t, 0, 0, 0>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 1, integer_sequence<std::size_t, 0>
            >::type
          , integer_sequence<std::size_t, 0, 1>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                std::size_t, 2, integer_sequence<std::size_t, 0, 1>
            >::type
          , integer_sequence<std::size_t, 0, 1, 2>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                int, 5, integer_sequence<int, 3>
            >::type
          , integer_sequence<int, 3, 5>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            integer_sequence_push_back<
                int, 9, integer_sequence<int, 3, 5>
            >::type
          , integer_sequence<int, 3, 5, 9>
        >::value), true);

    } // }}}

    { // type_list_push_front {{{

        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<> >::type
          , type_list<int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<int> >::type
          , type_list<int, int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<int, int> >::type
          , type_list<int, int, int>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<char> >::type
          , type_list<int, char>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_front<int, type_list<char, bool> >::type
          , type_list<int, char, bool>
        >::value), true);

    } // }}}

    { // type_list_push_back {{{

        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<> >::type
          , type_list<int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<int> >::type
          , type_list<int, int>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<int, type_list<int, int> >::type
          , type_list<int, int, int>
        >::value), true);

        BOOST_TEST_EQ((is_same<
            type_list_push_back<char, type_list<int> >::type
          , type_list<int, char>
        >::value), true);
        BOOST_TEST_EQ((is_same<
            type_list_push_back<bool, type_list<int, char> >::type
          , type_list<int, char, bool>
        >::value), true);

    } // }}}

    return boost::report_errors();
}